

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__dest;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  FILE *pFVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  size_t local_48;
  FILE *local_40;
  
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "wrjpgcom";
  }
  iVar11 = 1;
  pcVar8 = (char *)0x0;
  local_40 = (FILE *)0x0;
  local_48 = 0;
  bVar1 = true;
  while ((lVar10 = (long)iVar11, iVar11 < argc && (*argv[lVar10] == '-'))) {
    pFVar9 = (FILE *)(argv[lVar10] + 1);
    iVar2 = keymatch((char *)pFVar9,"replace",1);
    if (iVar2 == 0) {
      iVar2 = keymatch((char *)pFVar9,"cfile",2);
      if (iVar2 == 0) {
        iVar2 = keymatch((char *)pFVar9,"comment",1);
        if ((iVar2 == 0) || (iVar11 = iVar11 + 1, argc <= iVar11)) goto LAB_0010143d;
        pcVar8 = argv[iVar11];
        if (*pcVar8 == '\"') {
          __dest = (char *)malloc(65000);
          if (__dest == (char *)0x0) goto LAB_00101626;
          sVar4 = strlen(pcVar8);
          if (sVar4 - 0xfde6 < 0xffffffffffff0218) goto LAB_001016b2;
          strcpy(__dest,pcVar8 + 1);
          lVar10 = lVar10 + 2;
          while( true ) {
            sVar4 = strlen(__dest);
            if (((int)sVar4 != 0) && (uVar3 = (int)sVar4 - 1, __dest[uVar3] == '\"')) break;
            if (argc <= lVar10) {
              pcVar8 = "Missing ending quote mark";
              goto LAB_00101411;
            }
            pcVar8 = argv[lVar10];
            sVar5 = strlen(pcVar8);
            if ((sVar5 + sVar4) - 0xfde6 < 0xffffffffffff0218) goto LAB_001016b2;
            sVar4 = strlen(__dest);
            (__dest + sVar4)[0] = ' ';
            (__dest + sVar4)[1] = '\0';
            strcat(__dest,pcVar8);
            iVar11 = iVar11 + 1;
            lVar10 = lVar10 + 1;
          }
          __dest[uVar3] = '\0';
          pcVar8 = __dest;
        }
        else {
          sVar4 = strlen(pcVar8);
          if (64999 < sVar4) goto LAB_001016b2;
        }
        local_48 = strlen(pcVar8);
      }
      else {
        iVar11 = iVar11 + 1;
        if (argc <= iVar11) goto LAB_0010143d;
        pFVar9 = (FILE *)(long)iVar11;
        local_40 = fopen(argv[(long)pFVar9],"r");
        if (local_40 == (FILE *)0x0) goto LAB_001014bc;
      }
    }
    else {
      bVar1 = false;
    }
    iVar11 = iVar11 + 1;
  }
  pFVar9 = local_40;
  if (((pcVar8 != (char *)0x0) && (local_40 != (FILE *)0x0)) ||
     (((pcVar8 == (char *)0x0 && (local_40 == (FILE *)0x0)) && (argc <= iVar11)))) {
LAB_0010143d:
    usage();
  }
  if (iVar11 < argc) {
    infile = (FILE *)fopen(argv[lVar10],"rb");
    if ((FILE *)infile != (FILE *)0x0) goto LAB_0010148d;
    pcVar8 = argv[lVar10];
  }
  else {
    infile = (FILE *)_stdin;
LAB_0010148d:
    if (argc + -1 <= iVar11) {
      outfile = _stdout;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)malloc(65000);
        if (pcVar8 == (char *)0x0) {
LAB_00101626:
          pcVar8 = "Insufficient memory";
          goto LAB_00101411;
        }
        if (pFVar9 == (FILE *)0x0) {
          pFVar9 = _stdin;
        }
        local_48 = 0;
        while (iVar11 = getc(pFVar9), iVar11 != -1) {
          if (local_48 == 65000) goto LAB_001016b2;
          pcVar8[local_48] = (char)iVar11;
          local_48 = local_48 + 1;
        }
        if (local_40 != (FILE *)0x0) {
          fclose(local_40);
        }
      }
      iVar11 = getc((FILE *)infile);
      iVar2 = getc((FILE *)infile);
      if ((iVar11 == 0xff) && (iVar2 == 0xd8)) {
        write_marker(0xd8);
        iVar11 = 0;
LAB_00101547:
        do {
          iVar7 = iVar11;
          iVar2 = read_1_byte();
          iVar11 = iVar7 + 1;
        } while (iVar2 != 0xff);
        do {
          iVar11 = read_1_byte();
        } while (iVar11 == 0xff);
        if (iVar7 != 0) {
          fwrite("Warning: garbage data found in JPEG file\n",0x29,1,_stderr);
        }
        uVar6 = (ulong)(iVar11 - 0xc0U);
        if (iVar11 - 0xc0U < 0x3f) {
          if (uVar6 != 0x3e) {
            if ((0x200eeefUL >> (uVar6 & 0x3f) & 1) != 0) {
              iVar2 = (int)local_48;
              if (iVar2 != 0) {
                write_marker(0xfe);
                write_2_bytes(iVar2 + 2);
                for (lVar10 = 0; iVar2 != (int)lVar10; lVar10 = lVar10 + 1) {
                  write_1_byte((int)pcVar8[lVar10]);
                }
              }
              write_marker(iVar11);
              copy_rest_of_file();
              exit(0);
            }
            if (uVar6 != 0x1a) goto LAB_001015bb;
            pcVar8 = "SOS without prior SOFn";
            goto LAB_00101411;
          }
          if (bVar1) goto LAB_001015bb;
          uVar3 = read_2_bytes();
          if (uVar3 < 2) goto LAB_00101729;
          iVar11 = uVar3 - 2;
          while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
            read_1_byte();
          }
        }
        else {
LAB_001015bb:
          write_marker(iVar11);
          uVar3 = read_2_bytes();
          write_2_bytes(uVar3);
          if (uVar3 < 2) goto LAB_00101729;
          iVar11 = uVar3 - 2;
          while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
            iVar2 = read_1_byte();
            write_1_byte(iVar2);
          }
        }
        iVar11 = 0;
        goto LAB_00101547;
      }
      pcVar8 = "Not a JPEG file";
      goto LAB_00101411;
    }
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
LAB_001014bc:
    pcVar8 = argv[(long)pFVar9];
  }
  fprintf(_stderr,"%s: can\'t open %s\n",progname,pcVar8);
LAB_001016cf:
  exit(1);
LAB_001016b2:
  fprintf(_stderr,"Comment text may not exceed %u bytes\n",65000);
  goto LAB_001016cf;
LAB_00101729:
  pcVar8 = "Erroneous JPEG marker length";
LAB_00101411:
  fprintf(_stderr,"%s\n",pcVar8);
  goto LAB_001016cf;
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int keep_COM = 1;
  char *comment_arg = NULL;
  FILE *comment_file = NULL;
  unsigned int comment_length = 0;
  int marker;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "wrjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "replace", 1)) {
      keep_COM = 0;
    } else if (keymatch(arg, "cfile", 2)) {
      if (++argn >= argc) usage();
      if ((comment_file = fopen(argv[argn], "r")) == NULL) {
        fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
    } else if (keymatch(arg, "comment", 1)) {
      if (++argn >= argc) usage();
      comment_arg = argv[argn];
      /* If the comment text starts with '"', then we are probably running
       * under MS-DOG and must parse out the quoted string ourselves.  Sigh.
       */
      if (comment_arg[0] == '"') {
        comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
        if (comment_arg == NULL)
          ERREXIT("Insufficient memory");
        if (strlen(argv[argn]) + 2 >= (size_t)MAX_COM_LENGTH) {
          fprintf(stderr, "Comment text may not exceed %u bytes\n",
                  (unsigned int)MAX_COM_LENGTH);
          exit(EXIT_FAILURE);
        }
        strcpy(comment_arg, argv[argn] + 1);
        for (;;) {
          comment_length = (unsigned int)strlen(comment_arg);
          if (comment_length > 0 && comment_arg[comment_length - 1] == '"') {
            comment_arg[comment_length - 1] = '\0'; /* zap terminating quote */
            break;
          }
          if (++argn >= argc)
            ERREXIT("Missing ending quote mark");
          if (strlen(comment_arg) + strlen(argv[argn]) + 2 >=
              (size_t)MAX_COM_LENGTH) {
            fprintf(stderr, "Comment text may not exceed %u bytes\n",
                    (unsigned int)MAX_COM_LENGTH);
            exit(EXIT_FAILURE);
          }
          strcat(comment_arg, " ");
          strcat(comment_arg, argv[argn]);
        }
      } else if (strlen(argv[argn]) >= (size_t)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_length = (unsigned int)strlen(comment_arg);
    } else
      usage();
  }

  /* Cannot use both -comment and -cfile. */
  if (comment_arg != NULL && comment_file != NULL)
    usage();
  /* If there is neither -comment nor -cfile, we will read the comment text
   * from stdin; in this case there MUST be an input JPEG file name.
   */
  if (comment_arg == NULL && comment_file == NULL && argn >= argc)
    usage();

  /* Open the input file. */
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Open the output file. */
#ifdef TWO_FILE_COMMANDLINE
  /* Must have explicit output file name */
  if (argn != argc - 2) {
    fprintf(stderr, "%s: must name one input and one output file\n", progname);
    usage();
  }
  if ((outfile = fopen(argv[argn + 1], WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open %s\n", progname, argv[argn + 1]);
    exit(EXIT_FAILURE);
  }
#else
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  /* default output file is stdout */
#ifdef USE_SETMODE              /* need to hack file mode? */
  setmode(fileno(stdout), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
  if ((outfile = fdopen(fileno(stdout), WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open stdout\n", progname);
    exit(EXIT_FAILURE);
  }
#else
  outfile = stdout;
#endif
#endif /* TWO_FILE_COMMANDLINE */

  /* Collect comment text from comment_file or stdin, if necessary */
  if (comment_arg == NULL) {
    FILE *src_file;
    int c;

    comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
    if (comment_arg == NULL)
      ERREXIT("Insufficient memory");
    comment_length = 0;
    src_file = (comment_file != NULL ? comment_file : stdin);
    while ((c = getc(src_file)) != EOF) {
      if (comment_length >= (unsigned int)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_arg[comment_length++] = (char)c;
    }
    if (comment_file != NULL)
      fclose(comment_file);
  }

  /* Copy JPEG headers until SOFn marker;
   * we will insert the new comment marker just before SOFn.
   * This (a) causes the new comment to appear after, rather than before,
   * existing comments; and (b) ensures that comments come after any JFIF
   * or JFXX markers, as required by the JFIF specification.
   */
  marker = scan_JPEG_header(keep_COM);
  /* Insert the new COM marker, but only if nonempty text has been supplied */
  if (comment_length > 0) {
    write_marker(M_COM);
    write_2_bytes(comment_length + 2);
    while (comment_length > 0) {
      write_1_byte(*comment_arg++);
      comment_length--;
    }
  }
  /* Duplicate the remainder of the source file.
   * Note that any COM markers occurring after SOF will not be touched.
   */
  write_marker(marker);
  copy_rest_of_file();

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}